

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_s_unittest.cpp
# Opt level: O3

void __thiscall
VectorSUnitTest_access_raw_data_Test::TestBody(VectorSUnitTest_access_raw_data_Test *this)

{
  pointer *__ptr;
  char *pcVar1;
  vector_s<unsigned_int,_4UL> vc;
  vector_s<unsigned_int,_4UL> v;
  undefined1 local_78 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_70;
  AssertHelper local_68;
  undefined8 uStack_60;
  AssertHelper local_58;
  undefined1 local_50 [24];
  uint *local_38;
  vector_s<unsigned_int,_4UL> local_30;
  
  local_50._0_8_ = local_78;
  local_78 = (undefined1  [8])&DAT_200000001;
  pbStack_70 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x400000003;
  local_50._8_8_ = &DAT_00000004;
  estl::vector_s<unsigned_int,_4UL>::vector_s(&local_30,(initializer_list<unsigned_int> *)local_50);
  local_78._0_4_ = 1;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)local_50,"1u","*(v.data())",(uint *)local_78,local_30.data_ptr_);
  if (local_50[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_78);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50._8_8_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((_Alloc_hider *)local_50._8_8_)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x184,pcVar1);
    testing::internal::AssertHelper::operator=(&local_68,(Message *)local_78);
    testing::internal::AssertHelper::~AssertHelper(&local_68);
    if (local_78 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_78 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50._8_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_50 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50._8_8_
                );
  }
  local_78._0_4_ = 4;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)local_50,"4u","*(v.data() + 3)",(uint *)local_78,local_30.data_ptr_ + 3);
  if (local_50[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_78);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50._8_8_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((_Alloc_hider *)local_50._8_8_)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x185,pcVar1);
    testing::internal::AssertHelper::operator=(&local_68,(Message *)local_78);
    testing::internal::AssertHelper::~AssertHelper(&local_68);
    if (local_78 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_78 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50._8_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_50 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50._8_8_
                );
  }
  local_78 = (undefined1  [8])&local_68;
  local_68.data_ = (AssertHelperData *)&DAT_200000001;
  uStack_60 = 0x400000003;
  pbStack_70 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&DAT_00000004;
  estl::vector_s<unsigned_int,_4UL>::vector_s
            ((vector_s<unsigned_int,_4UL> *)local_50,(initializer_list<unsigned_int> *)local_78);
  local_68.data_._0_4_ = 1;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)local_78,"1u","*(vc.data())",(uint *)&local_68,local_38);
  if (local_78[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_68);
    if (pbStack_70 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (pbStack_70->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x189,pcVar1);
    testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    if (local_68.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_68.data_ + 8))();
    }
  }
  if (pbStack_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_70,pbStack_70);
  }
  local_68.data_._0_4_ = 4;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)local_78,"4u","*(vc.data() + 3)",(uint *)&local_68,local_38 + 3);
  if (local_78[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_68);
    if (pbStack_70 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (pbStack_70->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mlutken[P]nestle/estl/containers/unittest/vector_s_unittest.cpp"
               ,0x18a,pcVar1);
    testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    if (local_68.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_68.data_ + 8))();
    }
  }
  if (pbStack_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_70,pbStack_70);
  }
  return;
}

Assistant:

TEST_F(VectorSUnitTest, access_raw_data)
{
    vector_s<unsigned, 4> v{1u,2u,3u,4u};
    EXPECT_EQ(1u, *(v.data()));
    EXPECT_EQ(4u, *(v.data() + 3));

    // const variant of data() function
    vector_s<unsigned, 4> vc{1u,2u,3u,4u};
    EXPECT_EQ(1u, *(vc.data()));
    EXPECT_EQ(4u, *(vc.data() + 3));
}